

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_prev(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_50;
  xmlAttrPtr attr;
  xmlNodePtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:prev",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_50 = (xmlChar *)0x0;
    }
    else {
      local_50 = cur->name;
    }
    switch(*(undefined4 *)(local_50 + 8)) {
    case 2:
      attr = *(xmlAttrPtr *)(local_50 + 0x38);
      break;
    default:
      attr = *(xmlAttrPtr *)(local_50 + 0x38);
      break;
    case 9:
    case 0xd:
      attr = (xmlAttrPtr)0x0;
      break;
    case 0x12:
      attr = (xmlAttrPtr)0x0;
    }
    self_local = libxml_xmlNodePtrWrap((xmlNodePtr)attr);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_prev(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:prev", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = (xmlNodePtr) attr->prev;
            }
            break;
        case XML_NAMESPACE_DECL:
            res = NULL;
            break;
        default:
            res = cur->prev;
            break;
    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}